

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O0

ssize_t __thiscall
TestWaitingLogSink::send(TestWaitingLogSink *this,int __fd,void *__buf,size_t __n,int __flags)

{
  pthread_t __thread1;
  int iVar1;
  pthread_t __thread2;
  undefined4 extraout_var;
  ssize_t sVar2;
  int in_R9D;
  tm *in_stack_00000008;
  char *in_stack_00000010;
  size_t in_stack_ffffffffffffff70;
  string local_58;
  int local_38;
  tm *tm_time_local;
  size_t sStack_28;
  int line_local;
  char *base_filename_local;
  char *param_2_local;
  TestWaitingLogSink *pTStack_10;
  LogSeverity severity_local;
  TestWaitingLogSink *this_local;
  
  __thread1 = this->tid_;
  tm_time_local._4_4_ = __flags;
  sStack_28 = __n;
  base_filename_local = (char *)__buf;
  param_2_local._4_4_ = __fd;
  pTStack_10 = this;
  local_38 = in_R9D;
  __thread2 = pthread_self();
  iVar1 = pthread_equal(__thread1,__thread2);
  sVar2 = CONCAT44(extraout_var,iVar1);
  if (iVar1 != 0) {
    google::LogSink::ToString_abi_cxx11_
              (&local_58,(LogSink *)(ulong)param_2_local._4_4_,(LogSeverity)sStack_28,
               (char *)(ulong)tm_time_local._4_4_,local_38,in_stack_00000008,in_stack_00000010,
               in_stack_ffffffffffffff70);
    TestLogSinkWriter::Buffer(&this->writer_,&local_58);
    sVar2 = std::__cxx11::string::~string((string *)&local_58);
  }
  return sVar2;
}

Assistant:

virtual void send(LogSeverity severity, const char* /* full_filename */,
                    const char* base_filename, int line,
                    const struct tm* tm_time,
                    const char* message, size_t message_len) {
    // Push it to Writer thread if we are the original logging thread.
    // Note: Something like ThreadLocalLogSink is a better choice
    //       to do thread-specific LogSink logic for real.
    if (pthread_equal(tid_, pthread_self())) {
      writer_.Buffer(ToString(severity, base_filename, line,
                              tm_time, message, message_len));
    }
  }